

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<std::complex<long_double>_>::ReadBlockPositions
          (TPZFileEqnStorage<std::complex<long_double>_> *this)

{
  ostream *poVar1;
  long *__ptr;
  long in_RDI;
  TPZManVector<long,_10> *unaff_retaddr;
  int64_t nextpos;
  int64_t sizereturn;
  int ibl;
  int i;
  int aux;
  long local_28;
  size_t local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = *(int *)(in_RDI + 0xb0) * (*(int *)(in_RDI + 8) + -1);
  TPZManVector<long,_10>::Resize(unaff_retaddr,in_RDI);
  local_14 = 0;
  std::operator<<((ostream *)&std::cout,"Reading Block Positions\n");
  std::ostream::flush();
  local_20 = 0;
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 0xb0); local_10 = local_10 + 1) {
    std::operator<<((ostream *)&std::cout,"*");
    std::ostream::flush();
    if (local_10 % 0x14 == 0) {
      poVar1 = (ostream *)
               std::ostream::operator<<(&std::cout,(local_10 * 100) / *(int *)(in_RDI + 0xb0));
      std::operator<<(poVar1,"% Read\n");
      std::ostream::flush();
    }
    __ptr = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),(long)local_14);
    local_20 = fread(__ptr,8,(long)(*(int *)(in_RDI + 8) + -1),*(FILE **)(in_RDI + 0xa0));
    local_14 = *(int *)(in_RDI + 8) + -1 + local_14;
    local_20 = fread(&local_28,8,(long)(*(int *)(in_RDI + 8) + -1),*(FILE **)(in_RDI + 0xa0));
    fseek(*(FILE **)(in_RDI + 0xa0),local_28,0);
  }
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::ReadBlockPositions()
{
#ifdef PZ_LOG
	if(logger.isDebugEnabled() ) LOGPZ_DEBUG(logger,"Reading block positions")
#endif
	int aux = fNumBlocks * (fNumHeaders-1);
	fBlockPos.Resize(aux);
	int i, ibl = 0;
	cout << "Reading Block Positions\n";
	cout.flush();
	int64_t sizereturn;
	sizereturn = 0;
	for(i=0;i<fNumBlocks;i++) {
		cout << "*";
		cout.flush();
		if(!(i%20)){
			cout << 100*i/fNumBlocks << "% Read\n";
			cout.flush();
		}
		sizereturn = fread(&fBlockPos[ibl],sizeof(int64_t),fNumHeaders-1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != fNumHeaders-1) DebugStop();
#endif
		ibl+=fNumHeaders-1;
		int64_t nextpos;
		sizereturn = fread(&nextpos,sizeof(int64_t),fNumHeaders-1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != fNumHeaders-1) DebugStop();
#endif
		fseek(fIOStream,nextpos,SEEK_SET);
	}
}